

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

NeuralNetworkClassifier *
buildBasicNeuralNetworkClassifierModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringClassLabels,vector<long,_std::allocator<long>_> *intClassLabels,bool includeBias)

{
  pointer pbVar1;
  ulong uVar2;
  pointer pbVar3;
  int64_t *piVar4;
  int64_t value;
  Rep *pRVar5;
  Model *pMVar6;
  TensorAttributes *pTVar7;
  __type _Var8;
  int iVar9;
  ModelDescription *pMVar10;
  FeatureDescription *pFVar11;
  FeatureType *pFVar12;
  ArrayFeatureType *pAVar13;
  DictionaryFeatureType *this;
  NeuralNetworkClassifier *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  InnerProductLayerParams *this_03;
  WeightParams *pWVar14;
  NeuralNetworkLayer *pNVar15;
  undefined1 *puVar16;
  undefined8 *puVar17;
  int64_t *piVar18;
  uint64_t uVar19;
  long lVar20;
  undefined7 in_register_00000031;
  undefined7 in_register_00000089;
  uint64_t uVar21;
  void **ppvVar22;
  pointer pbVar23;
  void *pvVar24;
  uint64_t j;
  uint64_t uVar25;
  uint64_t j_1;
  initializer_list<long> __l;
  allocator_type local_13a;
  less<long> local_139;
  pointer local_138;
  undefined4 local_12c;
  Model *local_128;
  undefined4 local_11c;
  TensorAttributes *local_118;
  vector<long,_std::allocator<long>_> *__range2;
  NeuralNetworkLayer *local_108;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> className;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  local_12c = (undefined4)CONCAT71(in_register_00000089,includeBias);
  local_11c = (undefined4)CONCAT71(in_register_00000031,isUpdatable);
  pbVar1 = (stringClassLabels->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_138 = (stringClassLabels->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  __range2 = intClassLabels;
  pMVar10 = CoreML::Specification::Model::_internal_mutable_description(m);
  pFVar11 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&pMVar10->input_);
  pFVar12 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar12);
  pAVar13 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar12);
  className._M_dataplus._M_p = (pointer)(long)inTensorAttr->dimension;
  google::protobuf::RepeatedField<long>::Add(&pAVar13->shape_,(long *)&className);
  pAVar13->datatype_ = 0x10040;
  uVar2 = (pFVar11->super_MessageLite)._internal_metadata_.ptr_;
  puVar17 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  local_118 = inTensorAttr;
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pFVar11->name_,inTensorAttr->name,puVar17);
  CoreML::Specification::FeatureDescription::set_allocated_type(pFVar11,pFVar12);
  pMVar10 = CoreML::Specification::Model::_internal_mutable_description(m);
  pFVar11 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&pMVar10->output_);
  pFVar12 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar12);
  if (local_138 == pbVar1) {
    CoreML::Specification::FeatureType::_internal_mutable_int64type(pFVar12);
  }
  else {
    CoreML::Specification::FeatureType::_internal_mutable_stringtype(pFVar12);
  }
  uVar2 = (pFVar11->super_MessageLite)._internal_metadata_.ptr_;
  puVar17 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pFVar11->name_,"predictedClass",puVar17);
  CoreML::Specification::FeatureDescription::set_allocated_type(pFVar11,pFVar12);
  pMVar10 = CoreML::Specification::Model::_internal_mutable_description(m);
  pFVar11 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&pMVar10->output_);
  pFVar12 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar12);
  this = CoreML::Specification::FeatureType::_internal_mutable_dictionarytype(pFVar12);
  if (local_138 == pbVar1) {
    CoreML::Specification::DictionaryFeatureType::_internal_mutable_int64keytype(this);
  }
  else {
    CoreML::Specification::DictionaryFeatureType::_internal_mutable_stringkeytype(this);
  }
  uVar2 = (pFVar11->super_MessageLite)._internal_metadata_.ptr_;
  puVar17 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pFVar11->name_,"classProbabilities",puVar17);
  CoreML::Specification::FeatureDescription::set_allocated_type(pFVar11,pFVar12);
  pMVar10 = CoreML::Specification::Model::_internal_mutable_description(m);
  uVar2 = (pMVar10->super_MessageLite)._internal_metadata_.ptr_;
  puVar17 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pMVar10->predictedfeaturename_,"predictedClass",puVar17);
  pMVar10 = CoreML::Specification::Model::_internal_mutable_description(m);
  uVar2 = (pMVar10->super_MessageLite)._internal_metadata_.ptr_;
  puVar17 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pMVar10->predictedprobabilitiesname_,"classProbabilities",puVar17);
  local_128 = m;
  this_00 = CoreML::Specification::Model::_internal_mutable_neuralnetworkclassifier(m);
  if (local_138 == pbVar1) {
    piVar4 = (__range2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar18 = (__range2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start; piVar18 != piVar4; piVar18 = piVar18 + 1) {
      value = *piVar18;
      this_02 = CoreML::Specification::NeuralNetworkClassifier::_internal_mutable_int64classlabels
                          (this_00);
      CoreML::Specification::Int64Vector::_internal_add_vector(this_02,value);
    }
  }
  else {
    pbVar3 = (stringClassLabels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar23 = (stringClassLabels->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar23 != pbVar3;
        pbVar23 = pbVar23 + 1) {
      std::__cxx11::string::string((string *)&className,(string *)pbVar23);
      this_01 = CoreML::Specification::NeuralNetworkClassifier::_internal_mutable_stringclasslabels
                          (this_00);
      CoreML::Specification::StringVector::add_vector(this_01,&className);
      std::__cxx11::string::~string((string *)&className);
    }
  }
  local_100 = &this_00->layers_;
  local_108 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                        (local_100);
  pTVar7 = local_118;
  uVar2 = (local_108->super_MessageLite)._internal_metadata_.ptr_;
  puVar17 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&local_108->name_,"inner_product",puVar17);
  pNVar15 = local_108;
  CoreML::Specification::NeuralNetworkLayer::add_input(local_108,pTVar7->name);
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar15,"intermediateOutput");
  iVar9 = pTVar7->dimension;
  if (local_138 == pbVar1) {
    stringClassLabels =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)__range2;
  }
  uVar21 = (long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&((vector<long,_std::allocator<long>_> *)stringClassLabels)->
                       super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
                 super__Vector_impl_data._M_finish -
           (long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&((vector<long,_std::allocator<long>_> *)stringClassLabels)->
                       super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
                 super__Vector_impl_data._M_start >> (local_138 != pbVar1) * '\x02' + 3;
  this_03 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_innerproduct(pNVar15);
  this_03->inputchannels_ = (long)iVar9;
  this_03->outputchannels_ = uVar21;
  pWVar14 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_weights(this_03);
  className._M_dataplus._M_p = className._M_dataplus._M_p & 0xffffffff00000000;
  local_138 = (pointer)(long)iVar9;
  google::protobuf::RepeatedField<float>::Resize
            (&pWVar14->floatvalue_,iVar9 * (int)uVar21,(float *)&className);
  pvVar24 = (pWVar14->floatvalue_).arena_or_elements_;
  for (uVar19 = 0; (pointer)uVar19 != local_138; uVar19 = uVar19 + 1) {
    for (uVar25 = 0; uVar21 != uVar25; uVar25 = uVar25 + 1) {
      iVar9 = rand();
      *(float *)((long)pvVar24 + uVar25 * 4) = (float)iVar9 * 4.656613e-10;
    }
    pvVar24 = (void *)((long)pvVar24 + uVar21 * 4);
  }
  if ((char)local_12c != '\0') {
    this_03->hasbias_ = true;
    pWVar14 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_bias(this_03);
    className._M_dataplus._M_p = className._M_dataplus._M_p & 0xffffffff00000000;
    google::protobuf::RepeatedField<float>::Resize
              (&pWVar14->floatvalue_,(int)uVar21,(float *)&className);
    pvVar24 = (pWVar14->floatvalue_).arena_or_elements_;
    for (uVar19 = 0; uVar21 != uVar19; uVar19 = uVar19 + 1) {
      iVar9 = rand();
      *(float *)((long)pvVar24 + uVar19 * 4) = (float)iVar9 * 4.656613e-10;
    }
  }
  pNVar15 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (local_100);
  pMVar6 = local_128;
  uVar2 = (pNVar15->super_MessageLite)._internal_metadata_.ptr_;
  puVar17 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar15->name_,"softmax",puVar17);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar15,"intermediateOutput");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar15,"scoreVector");
  CoreML::Specification::NeuralNetworkLayer::_internal_mutable_softmax(pNVar15);
  if ((char)local_11c != '\0') {
    pMVar6->isupdatable_ = true;
    local_108->isupdatable_ = true;
    pWVar14 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_weights(this_03);
    pWVar14->isupdatable_ = true;
    if ((char)local_12c != '\0') {
      pWVar14 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_bias(this_03);
      pWVar14->isupdatable_ = true;
    }
    pMVar6 = local_128;
    addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetworkClassifier>
              (local_128,this_00,"cross_entropy_loss","scoreVector","target");
    addLearningRate<CoreML::Specification::NeuralNetworkClassifier>
              (this_00,kSgdOptimizer,0.699999988079071,0.0,1.0);
    className.field_2._M_allocated_capacity = 0x40;
    className.field_2._8_8_ = 0x80;
    className._M_dataplus._M_p = (pointer)0x10;
    className._M_string_length = 0x20;
    __l._M_len = 4;
    __l._M_array = (iterator)&className;
    std::set<long,_std::less<long>,_std::allocator<long>_>::set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_60,__l,&local_139,
               &local_13a);
    addMiniBatchSize<CoreML::Specification::NeuralNetworkClassifier>
              (this_00,kSgdOptimizer,0x20,1,100,
               (set<long,_std::less<long>,_std::allocator<long>_> *)&local_60);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_60);
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl._0_8_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    addEpochs<CoreML::Specification::NeuralNetworkClassifier>
              (this_00,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_98);
    local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c8._M_impl.super__Rb_tree_header._M_header;
    local_c8._M_impl._0_8_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
    addShuffleAndSeed<CoreML::Specification::NeuralNetworkClassifier>
              (this_00,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_c8)
    ;
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_c8);
    pMVar10 = CoreML::Specification::Model::_internal_mutable_description(pMVar6);
    google::protobuf::internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&(pMVar10->traininginput_).super_RepeatedPtrFieldBase);
    puVar16 = (undefined1 *)pMVar6->description_;
    if ((ModelDescription *)puVar16 == (ModelDescription *)0x0) {
      puVar16 = CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar5 = (((ModelDescription *)puVar16)->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar22 = pRVar5->elements;
    if (pRVar5 == (Rep *)0x0) {
      ppvVar22 = (void **)0x0;
    }
    iVar9 = (((ModelDescription *)puVar16)->input_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar20 = 0; (long)iVar9 * 8 != lVar20; lVar20 = lVar20 + 8) {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&className,*(FeatureDescription **)((long)ppvVar22 + lVar20))
      ;
      pMVar10 = CoreML::Specification::Model::_internal_mutable_description(pMVar6);
      pFVar11 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                          (&pMVar10->traininginput_);
      CoreML::Specification::FeatureDescription::CopyFrom(pFVar11,(FeatureDescription *)&className);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&className);
    }
    puVar16 = (undefined1 *)pMVar6->description_;
    if ((ModelDescription *)puVar16 == (ModelDescription *)0x0) {
      puVar16 = CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar5 = (((ModelDescription *)puVar16)->output_).super_RepeatedPtrFieldBase.rep_;
    ppvVar22 = pRVar5->elements;
    if (pRVar5 == (Rep *)0x0) {
      ppvVar22 = (void **)0x0;
    }
    iVar9 = (((ModelDescription *)puVar16)->output_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar20 = 0; (long)iVar9 * 8 != lVar20; lVar20 = lVar20 + 8) {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&className,*(FeatureDescription **)((long)ppvVar22 + lVar20))
      ;
      puVar16 = (undefined1 *)pMVar6->description_;
      if ((ModelDescription *)puVar16 == (ModelDescription *)0x0) {
        puVar16 = CoreML::Specification::_ModelDescription_default_instance_;
      }
      _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (className.field_2._M_allocated_capacity & 0xfffffffffffffffe),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)(((ModelDescription *)puVar16)->predictedfeaturename_).
                                      tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      if (_Var8) {
        pMVar10 = CoreML::Specification::Model::_internal_mutable_description(pMVar6);
        pFVar11 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                            (&pMVar10->traininginput_);
        CoreML::Specification::FeatureDescription::CopyFrom
                  (pFVar11,(FeatureDescription *)&className);
      }
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&className);
    }
  }
  return this_00;
}

Assistant:

Specification::NeuralNetworkClassifier* buildBasicNeuralNetworkClassifierModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, std::vector<std::string> stringClassLabels, std::vector<int64_t> intClassLabels, bool includeBias) {
    
    bool usesStringClassLabels = stringClassLabels.size() > 0;
    
    auto input = m.mutable_description()->add_input();
    auto inputType = new Specification::FeatureType;
    auto multiArray = inputType->mutable_multiarraytype();
    multiArray->mutable_shape()->Add(inTensorAttr->dimension);
    multiArray->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    input->set_name(inTensorAttr->name);
    input->set_allocated_type(inputType);
    
    auto output = m.mutable_description()->add_output();
    auto outputType = new Specification::FeatureType;
    if (usesStringClassLabels) {
        outputType->mutable_stringtype();
    } else {
        outputType->mutable_int64type();
    }
    
    output->set_name("predictedClass");
    output->set_allocated_type(outputType);
    
    output = m.mutable_description()->add_output();
    outputType = new Specification::FeatureType;
    auto dictionary = outputType->mutable_dictionarytype();
    if (usesStringClassLabels) {
        dictionary->mutable_stringkeytype();
    } else {
        dictionary->mutable_int64keytype();
    }
    
    output->set_name("classProbabilities");
    output->set_allocated_type(outputType);

    m.mutable_description()->set_predictedfeaturename("predictedClass");
    m.mutable_description()->set_predictedprobabilitiesname("classProbabilities");
    
    auto classifier = m.mutable_neuralnetworkclassifier();
    
    if (usesStringClassLabels) {
        for (auto className : stringClassLabels) {
            classifier->mutable_stringclasslabels()->add_vector(className);
        }
    } else {
        for (auto className : intClassLabels) {
            classifier->mutable_int64classlabels()->add_vector(className);
        }
    }
    
    // Add inner product layer
    auto innerProductLayer = classifier->add_layers();
    innerProductLayer->set_name("inner_product");
    innerProductLayer->add_input(inTensorAttr->name);
    innerProductLayer->add_output("intermediateOutput");
    
    uint64_t C_in = (uint64_t)inTensorAttr->dimension;
    uint64_t C_out = 0;
    
    if (usesStringClassLabels) {
        C_out = (uint64_t)stringClassLabels.size();
    } else {
        C_out = (uint64_t)intClassLabels.size();
    }
    
    auto innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(C_in);
    innerProductParams->set_outputchannels(C_out);
    
    ::google::protobuf::RepeatedField<float>* weightsWrite = innerProductParams->mutable_weights()->mutable_floatvalue();
    weightsWrite->Resize((int)C_in * (int)C_out, 0.0);
    float *destination_weights = weightsWrite->mutable_data();
    for (uint64_t i = 0; i < C_in; i++) {
        for (uint64_t j = 0; j < C_out; j++) {
            float random = float(rand())/float(RAND_MAX);
            destination_weights[i * C_out + j] = random;
        }
    }
    
    if (includeBias) {
        innerProductParams->set_hasbias(true);
        
        ::google::protobuf::RepeatedField<float>* biasWrite = innerProductParams->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize((int)1 * (int)C_out, 0.0);
        float *destination_bias = biasWrite->mutable_data();
        for (uint64_t i = 0; i < 1; i++) {
            for (uint64_t j = 0; j < C_out; j++) {
                float random = float(rand())/float(RAND_MAX);
                destination_bias[i * C_out + j] = random;
            }
        }
    }
    
    // Add inner product layer
    auto softmaxLayer = classifier->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input("intermediateOutput");
    softmaxLayer->add_output("scoreVector");
    softmaxLayer->mutable_softmax();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        innerProductLayer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        
        if (includeBias) {
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
        
        addCategoricalCrossEntropyLoss(m, classifier, "cross_entropy_loss", "scoreVector", "target");
        
        addLearningRate(classifier, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
        addMiniBatchSize(classifier, Specification::Optimizer::kSgdOptimizer, 32, 1, 100, {16, 32, 64, 128});
        addEpochs(classifier, 100, 1, 100, std::set<int64_t>());
        addShuffleAndSeed(classifier, 2019, 0, 2019, std::set<int64_t>());

        m.mutable_description()->clear_traininginput();
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
        for (auto feature : m.description().output()) {
            if (feature.name() == m.description().predictedfeaturename()) {
                auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
                trainingInput->CopyFrom(feature);
            }
        }
    }
    
    return classifier;
}